

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O3

int32 model_def_read(model_def_t **out_model_def,char *file_name)

{
  ulong uVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  acmod_id_t aVar5;
  int32 iVar6;
  acmod_id_t left_context;
  acmod_id_t right_context;
  FILE *pFVar7;
  lineiter_t *plVar8;
  ci_acmod_t *pcVar9;
  acmod_set_t *paVar10;
  char *pcVar11;
  byte *pbVar12;
  uint uVar13;
  char *fmt;
  long ln;
  ulong uVar14;
  ulong in_R8;
  uint32 uVar15;
  uint32 n_ci;
  undefined1 auVar16 [16];
  uint32 n_state;
  uint32 n;
  uint32 tmat;
  char tag [32];
  uint32 state [20];
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar17;
  uint local_11c;
  uint32 local_118;
  uint local_114;
  lineiter_t *local_110;
  acmod_set_t *local_108;
  uint local_fc;
  uint local_f8;
  uint32 local_f4;
  FILE *local_f0;
  ci_acmod_t *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  char **local_c0;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  void *local_98;
  char **local_90;
  uint32 local_88 [22];
  
  pFVar7 = fopen(file_name,"r");
  if (pFVar7 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x19d,"Unable to open %s for reading",file_name);
  }
  else {
    plVar8 = lineiter_start_clean((FILE *)pFVar7);
    if (plVar8 == (lineiter_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x1a6,"ERROR not even a version number in %s!?\n",file_name);
LAB_00107a01:
      fclose(pFVar7);
      plVar8 = (lineiter_t *)0x0;
    }
    else {
      pcVar11 = plVar8->buf;
      iVar3 = strcmp(pcVar11,"0.3");
      if (iVar3 == 0) {
        local_c8 = 0xffffffff;
        iVar3 = 6;
        local_d8 = 0xffffffff;
        local_f8 = 0xffffffff;
        local_11c = 0xffffffff;
        local_110 = (lineiter_t *)CONCAT44(local_110._4_4_,0xffffffff);
        local_e8 = (ci_acmod_t *)CONCAT44(local_e8._4_4_,0xffffffff);
        local_108 = (acmod_set_t *)out_model_def;
        local_f0 = pFVar7;
        do {
          plVar8 = lineiter_next(plVar8);
          if (plVar8 == (lineiter_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x1c5,"Incomplete count information in %s!?\n",file_name);
            pFVar7 = local_f0;
            goto LAB_00107a01;
          }
          __isoc99_sscanf(plVar8->buf,"%u %s",&local_114,&local_b8);
          if (CONCAT13(cStack_b2,CONCAT12(cStack_b3,CONCAT11(cStack_b4,cStack_b5))) == 0x657361 &&
              CONCAT13(cStack_b5,CONCAT12(cStack_b6,CONCAT11(cStack_b7,local_b8))) == 0x61625f6e) {
            local_d8 = (ulong)local_114;
          }
          else if (CONCAT11(cStack_b3,cStack_b4) == 0x69 &&
                   CONCAT13(cStack_b5,CONCAT12(cStack_b6,CONCAT11(cStack_b7,local_b8))) ==
                   0x72745f6e) {
            local_c8 = (ulong)local_114;
          }
          else if (CONCAT13(cStack_ad,CONCAT12(cStack_ae,CONCAT11(cStack_af,cStack_b0))) == 0x70616d
                   && CONCAT17(cStack_b1,
                               CONCAT16(cStack_b2,
                                        CONCAT15(cStack_b3,
                                                 CONCAT14(cStack_b4,
                                                          CONCAT13(cStack_b5,
                                                                   CONCAT12(cStack_b6,
                                                                            CONCAT11(cStack_b7,
                                                                                     local_b8)))))))
                      == 0x5f65746174735f6e) {
            local_f8 = local_114;
          }
          else if (CONCAT17(cStack_ac,
                            CONCAT16(cStack_ad,
                                     CONCAT15(cStack_ae,
                                              CONCAT14(cStack_af,
                                                       CONCAT13(cStack_b0,
                                                                CONCAT12(cStack_b1,
                                                                         CONCAT11(cStack_b2,
                                                                                  cStack_b3)))))))
                   == 0x65746174735f64 &&
                   CONCAT17(cStack_b1,
                            CONCAT16(cStack_b2,
                                     CONCAT15(cStack_b3,
                                              CONCAT14(cStack_b4,
                                                       CONCAT13(cStack_b5,
                                                                CONCAT12(cStack_b6,
                                                                         CONCAT11(cStack_b7,local_b8
                                                                                 ))))))) ==
                   0x735f646569745f6e) {
            local_11c = local_114;
          }
          else {
            auVar16[0] = -(local_b8 == 'n');
            auVar16[1] = -(cStack_b7 == '_');
            auVar16[2] = -(cStack_b6 == 't');
            auVar16[3] = -(cStack_b5 == 'i');
            auVar16[4] = -(cStack_b4 == 'e');
            auVar16[5] = -(cStack_b3 == 'd');
            auVar16[6] = -(cStack_b2 == '_');
            auVar16[7] = -(cStack_b1 == 'c');
            auVar16[8] = -(cStack_b0 == 'i');
            auVar16[9] = -(cStack_af == '_');
            auVar16[10] = -(cStack_ae == 's');
            auVar16[0xb] = -(cStack_ad == 't');
            auVar16[0xc] = -(cStack_ac == 'a');
            auVar16[0xd] = -(cStack_ab == 't');
            auVar16[0xe] = -(cStack_aa == 'e');
            auVar16[0xf] = -(cStack_a9 == '\0');
            if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
              local_e8 = (ci_acmod_t *)CONCAT44(local_e8._4_4_,local_114);
            }
            else {
              if (CONCAT13(cStack_ad,CONCAT12(cStack_ae,CONCAT11(cStack_af,cStack_b0))) != 0x74616d
                  || CONCAT17(cStack_b1,
                              CONCAT16(cStack_b2,
                                       CONCAT15(cStack_b3,
                                                CONCAT14(cStack_b4,
                                                         CONCAT13(cStack_b5,
                                                                  CONCAT12(cStack_b6,
                                                                           CONCAT11(cStack_b7,
                                                                                    local_b8)))))))
                     != 0x745f646569745f6e) {
                uVar4 = lineiter_lineno(plVar8);
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                        ,0x1e2,"Unknown tag %s in file at line %d\n",&local_b8,(ulong)uVar4);
                fclose(local_f0);
                goto LAB_00107a08;
              }
              local_110 = (lineiter_t *)CONCAT44(local_110._4_4_,local_114);
            }
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        plVar8 = lineiter_next(plVar8);
        pcVar9 = (ci_acmod_t *)
                 __ckd_calloc__(1,0x48,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1ec);
        local_108->ci = pcVar9;
        paVar10 = acmod_set_new();
        uVar14 = local_d8;
        pcVar9->name = (char *)paVar10;
        n_ci = (uint32)local_d8;
        acmod_set_set_n_ci_hint(paVar10,n_ci);
        uVar15 = (uint32)local_c8;
        local_108 = paVar10;
        acmod_set_set_n_tri_hint(paVar10,uVar15);
        local_d0 = (ulong)(uVar15 + n_ci);
        local_90 = (char **)__ckd_calloc__(local_d0,0x20,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                           ,0x1f5);
        pcVar9->attrib = local_90;
        *(uint *)&pcVar9->field_0x14 = local_f8;
        local_98 = __ckd_calloc__((ulong)local_f8,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                  ,0x1f8);
        *(undefined4 *)&pcVar9[1].name = local_e8._0_4_;
        *(uint *)((long)&pcVar9[1].name + 4) = local_11c;
        *(undefined4 *)&pcVar9[1].attrib = local_110._0_4_;
        *(undefined8 *)((long)&pcVar9[2].name + 4) = 0x1400000000;
        local_e8 = pcVar9;
        if (n_ci == 0) {
          local_11c = 0;
        }
        else {
          local_e0 = uVar14 & 0xffffffff;
          uVar14 = 0;
          local_11c = 0;
          do {
            local_118 = 0x14;
            pcVar11 = plVar8->buf;
            local_110 = plVar8;
            uVar4 = lineiter_lineno(plVar8);
            pcVar11 = strtok(pcVar11," \t");
            aVar5 = acmod_set_name2id(local_108,pcVar11);
            if (aVar5 != 0xffffffff) {
              fmt = "%s multiply defined at line %d\n";
              ln = 0xa7;
LAB_00107a3d:
              uVar14 = (ulong)uVar4;
              goto LAB_00107d84;
            }
            iVar3 = 3;
            do {
              pbVar12 = (byte *)strtok((char *)0x0," \t");
              uVar13 = *pbVar12 - 0x2d;
              if (uVar13 == 0) {
                uVar13 = (uint)pbVar12[1];
              }
              if (uVar13 != 0) {
                fmt = 
                "Expected l, r and posn to be \"-\" for ci phone %s at line %d, currently \'%s\'\n";
                ln = 0xae;
                goto LAB_00107a3d;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            iVar6 = parse_rem(&local_c0,&local_f4,local_88,&local_118,(uint32)in_R8);
            if (iVar6 != 0) goto LAB_00107d8b;
            aVar5 = acmod_set_add_ci(local_108,pcVar11,local_c0);
            ppcVar2 = local_90;
            uVar15 = local_118;
            *(acmod_id_t *)(local_90 + uVar14 * 4) = aVar5;
            *(uint32 *)((long)local_90 + uVar14 * 0x20 + 4) = local_f4;
            *(uint32 *)(local_90 + uVar14 * 4 + 2) = local_118;
            pcVar11 = (char *)((long)local_98 + (ulong)local_11c * 4);
            local_90[uVar14 * 4 + 1] = pcVar11;
            memcpy(pcVar11,local_88,(ulong)local_118 << 2);
            uVar4 = *(uint *)(ppcVar2 + uVar14 * 4 + 2);
            if (*(uint *)((long)&local_e8[2].name + 4) < uVar4) {
              *(uint *)((long)&local_e8[2].name + 4) = uVar4;
            }
            if (uVar4 < *(uint *)&local_e8[2].attrib) {
              *(uint *)&local_e8[2].attrib = uVar4;
            }
            plVar8 = lineiter_next(local_110);
            uVar14 = uVar14 + 1;
            local_11c = local_11c + uVar15;
          } while (uVar14 != local_e0);
        }
        uVar17 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        pFVar7 = local_f0;
        uVar14 = local_d8;
        if ((uint)local_d0 <= (uint)local_d8) {
LAB_00107c2c:
          pcVar9 = local_e8;
          *(int *)&local_e8->id = (int)local_d0;
          if (local_11c == local_f8) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x23d,"Model definition info:\n");
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x23e,"%u total models defined (%u base, %u tri)\n",(ulong)*(uint *)&pcVar9->id
                    ,uVar14 & 0xffffffff,CONCAT44(uVar17,(int)local_c8));
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x23f,"%u total states\n",(ulong)*(uint *)&pcVar9->field_0x14);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x240,"%u total tied states\n",(ulong)*(uint *)((long)&pcVar9[1].name + 4));
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x241,"%u total tied CI states\n",(ulong)*(uint *)&pcVar9[1].name);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x242,"%u total tied transition matrices\n",(ulong)*(uint *)&pcVar9[1].attrib);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x243,"%u max state/model\n",(ulong)*(uint *)((long)&pcVar9[2].name + 4));
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x244,"%u min state/model\n",(ulong)*(uint *)&pcVar9[2].attrib);
            fclose(pFVar7);
            lineiter_free(plVar8);
            return 0;
          }
          __assert_fail("j == n_total_map",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                        ,0x23b,"int32 model_def_read(model_def_t **, const char *)");
        }
        local_e0 = local_d8 & 0xffffffff;
        paVar10 = local_108;
        while( true ) {
          uVar15 = (uint32)in_R8;
          local_118 = 0x14;
          pcVar11 = plVar8->buf;
          uVar4 = lineiter_lineno(plVar8);
          pcVar11 = strtok(pcVar11," \t");
          aVar5 = acmod_set_name2id(paVar10,pcVar11);
          local_110 = plVar8;
          if (aVar5 == 0xffffffff) {
            fmt = "%s is an undefined base phone at line %d\n";
            ln = 0xd0;
            uVar14 = (ulong)uVar4;
            goto LAB_00107d84;
          }
          local_fc = uVar4;
          pcVar11 = strtok((char *)0x0," \t");
          left_context = acmod_set_name2id(paVar10,pcVar11);
          if (left_context == 0xffffffff) break;
          pcVar11 = strtok((char *)0x0," \t");
          right_context = acmod_set_name2id(paVar10,pcVar11);
          if (right_context == 0xffffffff) {
            fmt = "%s is an undefined base phone at line %d\n";
            ln = 0xe4;
            goto LAB_00107d7f;
          }
          pcVar11 = strtok((char *)0x0," \t");
          uVar14 = 0;
          while (*pcVar11 != "besiu"[uVar14]) {
            uVar14 = uVar14 + 1;
            if (uVar14 == 5) {
              fmt = "Unknown word posn %s found at line %d\n";
              ln = 0xf5;
              goto LAB_00107d7f;
            }
          }
          iVar6 = parse_rem(&local_c0,&local_f4,local_88,&local_118,uVar15);
          if (iVar6 != 0) goto LAB_00107d8b;
          in_R8 = uVar14 & 0xffffffff;
          aVar5 = acmod_set_add_tri(local_108,aVar5,left_context,right_context,(word_posn_t)uVar14,
                                    local_c0);
          ppcVar2 = local_90;
          uVar1 = local_e0;
          if (aVar5 == 0xffffffff) goto LAB_00107d8b;
          *(acmod_id_t *)(local_90 + local_e0 * 4) = aVar5;
          *(uint32 *)((long)local_90 + local_e0 * 0x20 + 4) = local_f4;
          *(uint32 *)(local_90 + local_e0 * 4 + 2) = local_118;
          pcVar11 = (char *)((long)local_98 + (ulong)local_11c * 4);
          local_90[local_e0 * 4 + 1] = pcVar11;
          memcpy(pcVar11,local_88,(ulong)local_118 << 2);
          uVar14 = local_d8;
          pFVar7 = local_f0;
          paVar10 = local_108;
          uVar4 = *(uint *)(ppcVar2 + uVar1 * 4 + 2);
          if (*(uint *)((long)&local_e8[2].name + 4) < uVar4) {
            *(uint *)((long)&local_e8[2].name + 4) = uVar4;
          }
          if (uVar4 < *(uint *)&local_e8[2].attrib) {
            *(uint *)&local_e8[2].attrib = uVar4;
          }
          plVar8 = lineiter_next(local_110);
          uVar17 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
          local_e0 = local_e0 + 1;
          local_11c = local_11c + local_118;
          if (local_e0 == local_d0) goto LAB_00107c2c;
        }
        fmt = "%s is an undefined base phone at line %d\n";
        ln = 0xda;
LAB_00107d7f:
        uVar14 = (ulong)local_fc;
LAB_00107d84:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,ln,fmt,pcVar11,uVar14);
LAB_00107d8b:
        fclose(local_f0);
        plVar8 = local_110;
      }
      else {
        iVar3 = lineiter_lineno(plVar8);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x1b0,"ERROR version(%s) == \"%s\", but expected %s at line %d.\n",file_name,
                pcVar11,"0.3",iVar3);
        fclose(pFVar7);
        pcVar11 = plVar8->buf;
        iVar3 = strcmp(pcVar11,"0.1");
        if (iVar3 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1b5,
                  "You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n"
                 );
          pcVar11 = plVar8->buf;
        }
        iVar3 = strcmp(pcVar11,"0.2");
        if (iVar3 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1b9,
                  "You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n"
                 );
        }
      }
    }
LAB_00107a08:
    lineiter_free(plVar8);
  }
  return -1;
}

Assistant:

int32
model_def_read(model_def_t **out_model_def,
	       const char *file_name)
{
    lineiter_t *li = NULL;
    uint32 n;
    char tag[32];
    acmod_set_t *acmod_set;
    uint32 i, j;
    acmod_id_t acmod_id;
    uint32 tmat;
    uint32 n_state;
    uint32 n_tri;
    uint32 n_base;
    uint32 n_total_map;
    uint32 n_tied_state;
    uint32 n_tied_ci_state;
    uint32 n_tied_tmat;
    uint32 state[MAX_N_STATE];
    uint32 n_total;
    model_def_t *omd;
    model_def_entry_t *mdef;
    uint32 *all_state;
    uint32 max_tmat;
    uint32 max_state;
    uint32 max_ci_state;
    
    FILE *fp;

    fp = fopen(file_name, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",
		      file_name);

	return S3_ERROR;
    }
    
    li = lineiter_start_clean(fp);

    if (li == NULL) {
	E_ERROR("ERROR not even a version number in %s!?\n",
		file_name);

	fclose(fp);

        lineiter_free(li);
	return S3_ERROR;
    }

    if (strcmp(li->buf, MODEL_DEF_VERSION) != 0) {
	E_ERROR("ERROR version(%s) == \"%s\", but expected %s at line %d.\n",
		file_name, li->buf, MODEL_DEF_VERSION, lineiter_lineno(li));

	fclose(fp);
	
	if (strcmp(li->buf, "0.1") == 0) {
	    E_ERROR("You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n");
	}
	
	if (strcmp(li->buf, "0.2") == 0) {
	    E_ERROR("You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n");
	}
	
        lineiter_free(li);
	return S3_ERROR;
    }

    n_tri = n_base = n_total_map = n_tied_state = n_tied_ci_state = n_tied_tmat = NO_NUMBER;
    for ( i = 0; i < 6; i++) {
        li = lineiter_next(li);
        if (li == NULL) {
	    E_ERROR("Incomplete count information in %s!?\n",
		    file_name);
	    
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	sscanf(li->buf, "%u %s", &n, tag);

	if (strcmp(tag, "n_base") == 0) {
	    n_base = n;
	}	
	else if (strcmp(tag, "n_tri") == 0) {
	    n_tri = n;
	}
	else if (strcmp(tag, "n_state_map") == 0) {
	    n_total_map = n;
	}
	else if (strcmp(tag, "n_tied_state") == 0) {
	    n_tied_state = n;
	}
	else if (strcmp(tag, "n_tied_ci_state") == 0) {
	    n_tied_ci_state = n;
	}
	else if (strcmp(tag, "n_tied_tmat") == 0) {
	    n_tied_tmat = n;
	}
	else {
	    E_ERROR("Unknown tag %s in file at line %d\n",
		    tag, lineiter_lineno(li));
	    	    
	    fclose(fp);

            lineiter_free(li);
	    return S3_ERROR;
	}
    }
    li = lineiter_next(li);

    *out_model_def = omd = ckd_calloc(1, sizeof(model_def_t));
    omd->acmod_set = acmod_set = acmod_set_new();

    /* give the acmod_set module some storage allocation requirements */
    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    n_total = n_base + n_tri;

    omd->defn = mdef = ckd_calloc(n_total, sizeof(model_def_entry_t));
    omd->n_total_state = n_total_map;

    all_state = ckd_calloc(n_total_map, sizeof(uint32));
    
    omd->n_tied_ci_state = n_tied_ci_state;
    omd->n_tied_state = n_tied_state;
    omd->n_tied_tmat = n_tied_tmat;

    omd->max_n_state = 0;
    omd->min_n_state = MAX_N_STATE;

    for (i = 0, j = 0, max_state = 0, max_ci_state = 0, max_tmat = 0;
	 i < n_base; i++, j += n_state) {
	n_state = MAX_N_STATE;
	if (parse_base_line(li->buf,
			    lineiter_lineno(li),
	                    &acmod_id,
			    &tmat,
			    state,
			    &n_state,
			    acmod_set) != S3_SUCCESS) {

	    fclose(fp);
            lineiter_free(li);
            return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];

	memcpy((char *)mdef[i].state, (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);

	li = lineiter_next(li);
    }

    for (; i < n_total; i++, j += n_state) {
	n_state = MAX_N_STATE;

	if (parse_tri_line(li->buf,
			   lineiter_lineno(li),
			   &acmod_id,
			   &tmat,
			   state,
			   &n_state,
			   acmod_set) != S3_SUCCESS) {
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];
	memcpy((char *)mdef[i].state,
	       (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);
	li = lineiter_next(li);
    }

    omd->n_defn = n_total;

    assert(j == n_total_map);
    
    E_INFO("Model definition info:\n");
    E_INFO("%u total models defined (%u base, %u tri)\n", omd->n_defn, n_base, n_tri);
    E_INFO("%u total states\n", omd->n_total_state);
    E_INFO("%u total tied states\n", omd->n_tied_state);
    E_INFO("%u total tied CI states\n", omd->n_tied_ci_state);
    E_INFO("%u total tied transition matrices\n", omd->n_tied_tmat);
    E_INFO("%u max state/model\n", omd->max_n_state);
    E_INFO("%u min state/model\n", omd->min_n_state);

    fclose(fp);

    lineiter_free(li);
    return S3_SUCCESS;
}